

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

bool __thiscall CLI::App::remove_subcommand(App *this,App *subcom)

{
  App *pAVar1;
  element_type *peVar2;
  shared_ptr<CLI::App> *psVar3;
  const_iterator cVar4;
  __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
  __position;
  App *pAVar5;
  _Rb_tree_header *p_Var6;
  pointer psVar7;
  App *pAVar8;
  App_p *sub;
  pointer psVar9;
  
  psVar9 = (this->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar7 = (this->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar9 != psVar7) {
    do {
      pAVar1 = (psVar9->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      pAVar8 = subcom;
      while( true ) {
        pAVar5 = pAVar1;
        p_Var6 = &(pAVar5->exclude_subcommands_)._M_t._M_impl.super__Rb_tree_header;
        for (cVar4._M_node =
                  (pAVar5->exclude_subcommands_)._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_left;
            ((_Rb_tree_header *)cVar4._M_node != p_Var6 && (*(App **)(cVar4._M_node + 1) != pAVar8))
            ; cVar4._M_node = (_Base_ptr)::std::_Rb_tree_increment(cVar4._M_node)) {
        }
        if ((_Rb_tree_header *)cVar4._M_node == p_Var6) break;
        pAVar1 = *(App **)(cVar4._M_node + 1);
        ::std::
        _Rb_tree<CLI::App*,CLI::App*,std::_Identity<CLI::App*>,std::less<CLI::App*>,std::allocator<CLI::App*>>
        ::erase_abi_cxx11_((_Rb_tree<CLI::App*,CLI::App*,std::_Identity<CLI::App*>,std::less<CLI::App*>,std::allocator<CLI::App*>>
                            *)&pAVar5->exclude_subcommands_,cVar4);
        pAVar8 = pAVar5;
      }
      peVar2 = (psVar9->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      p_Var6 = &(peVar2->need_subcommands_)._M_t._M_impl.super__Rb_tree_header;
      for (cVar4._M_node =
                *(_Base_ptr *)
                 ((long)&(peVar2->need_subcommands_)._M_t._M_impl.super__Rb_tree_header._M_header +
                 0x10);
          ((_Rb_tree_header *)cVar4._M_node != p_Var6 && (*(App **)(cVar4._M_node + 1) != subcom));
          cVar4._M_node = (_Base_ptr)::std::_Rb_tree_increment(cVar4._M_node)) {
      }
      if ((_Rb_tree_header *)cVar4._M_node != p_Var6) {
        ::std::
        _Rb_tree<CLI::App*,CLI::App*,std::_Identity<CLI::App*>,std::less<CLI::App*>,std::allocator<CLI::App*>>
        ::erase_abi_cxx11_((_Rb_tree<CLI::App*,CLI::App*,std::_Identity<CLI::App*>,std::less<CLI::App*>,std::allocator<CLI::App*>>
                            *)&peVar2->need_subcommands_,cVar4);
      }
      psVar9 = psVar9 + 1;
    } while (psVar9 != psVar7);
    psVar9 = (this->subcommands_).
             super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar7 = (this->subcommands_).
             super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  __position = ::std::
               __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<CLI::App>*,std::vector<std::shared_ptr<CLI::App>,std::allocator<std::shared_ptr<CLI::App>>>>,__gnu_cxx::__ops::_Iter_pred<CLI::App::remove_subcommand(CLI::App*)::_lambda(std::shared_ptr<CLI::App>const&)_1_>>
                         (psVar9,psVar7,subcom);
  psVar3 = (this->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current != psVar3) {
    std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::_M_erase
              (&this->subcommands_,(iterator)__position._M_current);
  }
  return __position._M_current != psVar3;
}

Assistant:

CLI11_INLINE bool App::remove_subcommand(App *subcom) {
    // Make sure no links exist
    for(App_p &sub : subcommands_) {
        sub->remove_excludes(subcom);
        sub->remove_needs(subcom);
    }

    auto iterator = std::find_if(
        std::begin(subcommands_), std::end(subcommands_), [subcom](const App_p &v) { return v.get() == subcom; });
    if(iterator != std::end(subcommands_)) {
        subcommands_.erase(iterator);
        return true;
    }
    return false;
}